

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_move_from_sr(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *pTVar1;
  TCGv_i32 pTVar2;
  int nr;
  
  pTVar1 = s->uc->tcg_ctx;
  if (((((s->base).tb)->flags & 0x2000) != 0) || (nr = 8, (env->features & 1) != 0)) {
    pTVar2 = gen_get_sr(s);
    pTVar2 = gen_ea_mode(env,s,insn >> 3 & 7,insn & 7,1,pTVar2,(TCGv_i32 *)0x0,EA_STORE,
                         (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar2 != pTVar1->NULL_QREG) {
      return;
    }
    nr = 3;
  }
  gen_exception(s,(s->base).pc_next,nr);
  return;
}

Assistant:

DISAS_INSN(move_from_sr)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv sr;

    if (IS_USER(s) && !m68k_feature(env, M68K_FEATURE_M68000)) {
        gen_exception(s, s->base.pc_next, EXCP_PRIVILEGE);
        return;
    }
    sr = gen_get_sr(s);
    DEST_EA(env, insn, OS_WORD, sr, NULL);
}